

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

char * xml_strtok_r(char *str,char *delim,char **nextp)

{
  size_t sVar1;
  char *pcVar2;
  char *__s;
  
  if (str == (char *)0x0) {
    str = *(char **)delim;
  }
  sVar1 = strspn(str," ");
  if (str[sVar1] == '\0') {
    __s = (char *)0x0;
  }
  else {
    __s = str + sVar1;
    sVar1 = strcspn(__s," ");
    pcVar2 = __s + sVar1;
    if (__s[sVar1] != '\0') {
      *pcVar2 = '\0';
      pcVar2 = pcVar2 + 1;
    }
    *(char **)delim = pcVar2;
  }
  return __s;
}

Assistant:

static char* xml_strtok_r(char *str, const char *delim, char **nextp) {
	char *ret;

	if (str == NULL) {
		str = *nextp;
	}

	str += strspn(str, delim);

	if (*str == '\0') {
		return NULL;
	}

	ret = str;

	str += strcspn(str, delim);

	if (*str) {
		*str++ = '\0';
	}

	*nextp = str;

	return ret;
}